

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Maybe<kj::String> * __thiscall
kj::anon_unknown_36::WebSocketImpl::getPreferredExtensions
          (Maybe<kj::String> *__return_storage_ptr__,WebSocketImpl *this,ExtensionsContext ctx)

{
  bool bVar1;
  CompressionParameters *this_00;
  CompressionParameters arr [1];
  CompressionParameters local_68;
  ArrayPtr<kj::CompressionParameters> local_38;
  Array<char> local_28;
  
  this_00 = &local_68;
  if ((this->maskKeyGenerator).ptr == (EntropySource *)0x0) {
    if (ctx != REQUEST) goto LAB_00315020;
    if ((this->compressionConfig).ptr.isSet == true) {
      kj::_::generateExtensionResponse
                ((String *)&local_68,&(this->compressionConfig).ptr.field_1.value);
      this_00 = &local_68;
      goto LAB_00315053;
    }
    (__return_storage_ptr__->ptr).isSet = true;
    (__return_storage_ptr__->ptr).field_1.value.content.ptr = (char *)0x0;
    (__return_storage_ptr__->ptr).field_1.value.content.size_ = 0;
    (__return_storage_ptr__->ptr).field_1.value.content.disposer = (ArrayDisposer *)0x0;
  }
  else {
    if (ctx != RESPONSE) {
LAB_00315020:
      (__return_storage_ptr__->ptr).isSet = false;
      return __return_storage_ptr__;
    }
    if ((this->compressionConfig).ptr.isSet == true) {
      local_68._0_2_ = *(undefined2 *)&(this->compressionConfig).ptr.field_1;
      bVar1 = (this->compressionConfig).ptr.field_1.value.outboundMaxWindowBits.ptr.isSet;
      local_68.outboundMaxWindowBits.ptr.isSet = bVar1;
      if (bVar1 == true) {
        local_68.outboundMaxWindowBits.ptr.field_1 =
             *(anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)
              ((long)&(this->compressionConfig).ptr.field_1 + 0x10);
      }
      local_68.inboundMaxWindowBits.ptr.isSet =
           (this->compressionConfig).ptr.field_1.value.inboundMaxWindowBits.ptr.isSet;
      if (local_68.inboundMaxWindowBits.ptr.isSet == true) {
        local_68.inboundMaxWindowBits.ptr.field_1 =
             *(anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)
              ((long)&(this->compressionConfig).ptr.field_1 + 0x20);
      }
      local_38.size_ = 1;
      local_38.ptr = &local_68;
      kj::_::generateExtensionRequest((String *)&local_28,&local_38);
      this_00 = (CompressionParameters *)&local_28;
LAB_00315053:
      (__return_storage_ptr__->ptr).isSet = true;
      (__return_storage_ptr__->ptr).field_1.value.content.ptr =
           ((Array<char> *)&((Array<char> *)this_00)->ptr)->ptr;
      (__return_storage_ptr__->ptr).field_1.value.content.size_ = ((Array<char> *)this_00)->size_;
      (__return_storage_ptr__->ptr).field_1.value.content.disposer =
           ((Array<char> *)this_00)->disposer;
      ((Array<char> *)&((Array<char> *)this_00)->ptr)->ptr = (char *)0x0;
      ((Array<char> *)this_00)->size_ = 0;
      goto LAB_00315099;
    }
    (__return_storage_ptr__->ptr).isSet = true;
    (__return_storage_ptr__->ptr).field_1.value.content.ptr = (char *)0x0;
    (__return_storage_ptr__->ptr).field_1.value.content.size_ = 0;
    (__return_storage_ptr__->ptr).field_1.value.content.disposer = (ArrayDisposer *)0x0;
  }
  local_68.outboundMaxWindowBits.ptr.field_1.value = 0;
  local_68.outboundNoContextTakeover = false;
  local_68.inboundNoContextTakeover = false;
  local_68._2_6_ = 0;
  local_68.outboundMaxWindowBits.ptr.isSet = false;
  local_68.outboundMaxWindowBits.ptr._1_7_ = 0;
LAB_00315099:
  Array<char>::~Array((Array<char> *)this_00);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<kj::String> getPreferredExtensions(ExtensionsContext ctx) override {
    if (maskKeyGenerator == kj::none) {
      // `this` is the server side of a websocket.
      if (ctx == ExtensionsContext::REQUEST) {
        // The other WebSocket is (going to be) the client side of a WebSocket, i.e. this is a
        // proxying pass-through scenario. Optimization is possible. Confusingly, we have to use
        // generateExtensionResponse() (even though we're generating headers to be passed in a
        // request) because this is the function that correctly maps our config's inbound/outbound
        // to client/server.
        KJ_IF_SOME(c, compressionConfig) {
          return _::generateExtensionResponse(c);
        } else {
          return kj::String(nullptr);  // recommend no compression
        }
      } else {
        // We're apparently arranging to pump from the server side of one WebSocket to the server
        // side of another; i.e., we are a server, we have two clients, and we're trying to pump
        // between them. We cannot optimize this case, because the masking requirements are
        // different for client->server vs. server->client messages. Since we have to parse out
        // the messages anyway there's no point in trying to match extensions, so return null.
        return kj::none;
      }
    }